

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::SourceCodeInfo_Location::MergePartialFromCodedStream
          (SourceCodeInfo_Location *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  void *pvVar4;
  Arena *this_03;
  char *data;
  bool bVar5;
  uint32 uVar6;
  string *psVar7;
  Type *pTVar8;
  RepeatedField<int> *pRVar9;
  UnknownFieldSet *unknown_fields;
  int iVar10;
  char cVar11;
  uint tag;
  ulong uVar12;
  Rep *pRVar13;
  
  this_00 = &this->leading_detached_comments_;
  this_01 = &this->trailing_comments_;
  this_02 = &this->leading_comments_;
LAB_003c2734:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003c2758;
      input->buffer_ = pbVar3 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003c2758:
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar12 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar6 | uVar12;
    }
    tag = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto switchD_003c27d4_caseD_5;
    cVar11 = (char)uVar12;
    switch((uint)(uVar12 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar11 == '\b') {
        uVar6 = 10;
        pRVar9 = &this->path_;
LAB_003c2936:
        bVar5 = internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,uVar6,input,pRVar9);
      }
      else {
        pRVar9 = &this->path_;
        if ((tag & 0xff) != 10) break;
LAB_003c287a:
        bVar5 = internal::WireFormatLite::
                ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,pRVar9);
      }
      goto LAB_003c27b0;
    case 2:
      if (cVar11 == '\x10') {
        uVar6 = 0x12;
        pRVar9 = &this->span_;
        goto LAB_003c2936;
      }
      pRVar9 = &this->span_;
      if ((tag & 0xff) == 0x12) goto LAB_003c287a;
      break;
    case 3:
      if (cVar11 == '\x1a') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        psVar7 = (this->leading_comments_).ptr_;
        if (psVar7 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_02,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar7 = this_02->ptr_;
        }
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar7);
        if (!bVar5) {
          return false;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_02->ptr_->_M_dataplus)._M_p,(int)this_02->ptr_->_M_string_length,PARSE,
                   "google.protobuf.SourceCodeInfo.Location.leading_comments");
        goto LAB_003c2734;
      }
      break;
    case 4:
      if (cVar11 == '\"') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        psVar7 = (this->trailing_comments_).ptr_;
        if (psVar7 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_01,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar7 = this_01->ptr_;
        }
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar7);
        if (!bVar5) {
          return false;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_01->ptr_->_M_dataplus)._M_p,(int)this_01->ptr_->_M_string_length,PARSE,
                   "google.protobuf.SourceCodeInfo.Location.trailing_comments");
        goto LAB_003c2734;
      }
      break;
    case 6:
      if (cVar11 == '2') {
        pRVar13 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar13 == (Rep *)0x0) {
          iVar10 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_;
LAB_003c2956:
          internal::RepeatedPtrFieldBase::Reserve(&this_00->super_RepeatedPtrFieldBase,iVar10 + 1);
          pRVar13 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
          iVar10 = pRVar13->allocated_size;
LAB_003c2967:
          pRVar13->allocated_size = iVar10 + 1;
          this_03 = (this_00->super_RepeatedPtrFieldBase).arena_;
          if (this_03 == (Arena *)0x0) {
            psVar7 = (string *)operator_new(0x20);
            (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
            psVar7->_M_string_length = 0;
            (psVar7->field_2)._M_local_buf[0] = '\0';
          }
          else {
            psVar7 = (string *)
                     Arena::AllocateAligned
                               (this_03,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
            psVar7->_M_string_length = 0;
            (psVar7->field_2)._M_local_buf[0] = '\0';
            Arena::AddListNode(this_03,psVar7,internal::arena_destruct_object<std::__cxx11::string>)
            ;
            pRVar13 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
          }
          iVar10 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
          (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
          pRVar13->elements[iVar10] = psVar7;
        }
        else {
          iVar2 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
          iVar10 = pRVar13->allocated_size;
          if (iVar10 <= iVar2) {
            if (iVar10 == (this->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_003c2956;
            goto LAB_003c2967;
          }
          (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
          psVar7 = (string *)pRVar13->elements[iVar2];
        }
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar7);
        if (!bVar5) {
          return false;
        }
        pTVar8 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->leading_detached_comments_).super_RepeatedPtrFieldBase.
                            current_size_ + -1);
        data = (pTVar8->_M_dataplus)._M_p;
        pTVar8 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->leading_detached_comments_).super_RepeatedPtrFieldBase.
                            current_size_ + -1);
        internal::WireFormatLite::VerifyUtf8String
                  (data,(int)pTVar8->_M_string_length,PARSE,
                   "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
        goto LAB_003c2734;
      }
    }
switchD_003c27d4_caseD_5:
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    pvVar4 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      unknown_fields =
           internal::
           InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ::mutable_unknown_fields_slow
                     (&(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     );
    }
    else {
      unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    bVar5 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_003c27b0:
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool SourceCodeInfo_Location::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.SourceCodeInfo.Location)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int32 path = 1 [packed = true];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_path())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 10u, input, this->mutable_path())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 span = 2 [packed = true];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_span())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(16u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 18u, input, this->mutable_span())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string leading_comments = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_leading_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->leading_comments().data(), this->leading_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.SourceCodeInfo.Location.leading_comments");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string trailing_comments = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_trailing_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->trailing_comments().data(), this->trailing_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.SourceCodeInfo.Location.trailing_comments");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string leading_detached_comments = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_leading_detached_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->leading_detached_comments(this->leading_detached_comments_size() - 1).data(),
            this->leading_detached_comments(this->leading_detached_comments_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.SourceCodeInfo.Location)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.SourceCodeInfo.Location)
  return false;
#undef DO_
}